

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O3

void __thiscall ASN1Test_SetTime_Test::TestBody(ASN1Test_SetTime_Test *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  uchar *puVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  _Head_base<0UL,_asn1_string_st_*,_false> _Var7;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *in_R9;
  ScopedTrace gtest_trace_1014;
  UniquePtr<ASN1_TIME> choice;
  UniquePtr<ASN1_GENERALIZEDTIME> generalized;
  UniquePtr<ASN1_UTCTIME> utc;
  int64_t tt;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  ScopedTrace local_a9;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Head_base<0UL,_asn1_string_st_*,_false> local_88;
  AssertHelper local_80;
  _Head_base<0UL,_asn1_string_st_*,_false> local_78;
  _Head_base<0UL,_asn1_string_st_*,_false> local_70;
  AssertHelper local_68;
  char **local_60;
  time_t local_58;
  int64_t local_50;
  anon_struct_32_4_837a7bc6 *local_48;
  char **local_40;
  char *local_38;
  
  ppcVar4 = &TestBody::kTests[0].utc;
  lVar6 = 0x1a0;
  do {
    local_48 = (anon_struct_32_4_837a7bc6 *)(ppcVar4 + -2);
    testing::ScopedTrace::ScopedTrace<long>
              (&local_a9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x3f6,(long *)local_48);
    local_58 = ((anon_struct_32_4_837a7bc6 *)(ppcVar4 + -2))->time;
    local_70._M_head_impl = (asn1_string_st *)ASN1_UTCTIME_set((ASN1_UTCTIME *)0x0,local_58);
    auVar1 = local_c0;
    pcVar10 = *ppcVar4;
    local_60 = ppcVar4;
    if (pcVar10 == (char *)0x0) {
      local_c0[0] = (internal)(local_70._M_head_impl == (asn1_string_st *)0x0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_70._M_head_impl != (asn1_string_st *)0x0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,(AssertionResult *)0x51285f,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x403,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
        _Var7._M_head_impl = local_78._M_head_impl;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
          _Var7._M_head_impl = local_78._M_head_impl;
        }
LAB_001c6e31:
        if (_Var7._M_head_impl != (asn1_string_st *)0x0) {
          (**(code **)(*(long *)_Var7._M_head_impl + 8))();
        }
        goto LAB_001c6e3c;
      }
    }
    else {
      local_c0[0] = (internal)(local_70._M_head_impl != (asn1_string_st *)0x0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_70._M_head_impl == (asn1_string_st *)0x0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,(AssertionResult *)0x51285f,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fa,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if (local_78._M_head_impl != (asn1_string_st *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
        goto LAB_001c7ca2;
      }
      local_c0._4_4_ = auVar1._4_4_;
      local_c0._0_4_ = 0x17;
      iVar3 = ASN1_STRING_type((ASN1_STRING *)local_70._M_head_impl);
      local_78._M_head_impl._0_4_ = iVar3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a8,"23","ASN1_STRING_type(utc.get())",(int *)local_c0,
                 (int *)&local_78);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        pcVar8 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fb,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      _Var7._M_head_impl = local_70._M_head_impl;
      puVar5 = ASN1_STRING_get0_data(local_70._M_head_impl);
      iVar3 = ASN1_STRING_length((ASN1_STRING *)_Var7._M_head_impl);
      local_c0 = (undefined1  [8])(long)iVar3;
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5;
      testing::internal::
      CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                ((internal *)local_a8,"t.utc","ASN1StringToStringView(utc.get())",local_60,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_c0);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        pcVar9 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fc,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      bVar2 = ASN1Time_check_posix(local_70._M_head_impl,local_58);
      local_c0[0] = (internal)bVar2;
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,
                   (AssertionResult *)"ASN1Time_check_posix(utc.get(), t.time)","false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fd,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if (local_78._M_head_impl != (asn1_string_st *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
      }
      iVar3 = ASN1_TIME_to_posix(local_70._M_head_impl,&local_50);
      local_c0._0_4_ = iVar3;
      local_78._M_head_impl._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a8,"ASN1_TIME_to_posix(utc.get(), &tt)","1",(int *)local_c0,
                 (int *)&local_78);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        pcVar9 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fe,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_a8,"tt","t.time",&local_50,&local_48->time);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        pcVar9 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3ff,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      PrintStringToBIO_abi_cxx11_((string *)local_a8,local_70._M_head_impl,ASN1_UTCTIME_print);
      ppcVar4 = local_60 + 1;
      testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                ((internal *)local_c0,"PrintStringToBIO(utc.get(), &ASN1_UTCTIME_print)","t.printed"
                 ,(string *)local_a8,ppcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
      }
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        pcVar9 = "";
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x400,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
        }
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
      PrintStringToBIO_abi_cxx11_((string *)local_a8,local_70._M_head_impl,ASN1_TIME_print);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                ((internal *)local_c0,"PrintStringToBIO(utc.get(), &ASN1_TIME_print)","t.printed",
                 (string *)local_a8,ppcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
      }
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        pcVar9 = "";
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x401,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        _Var7._M_head_impl = (asn1_string_st *)CONCAT71(local_a8._1_7_,local_a8[0]);
        goto LAB_001c6e31;
      }
LAB_001c6e3c:
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
    }
    local_78._M_head_impl =
         (asn1_string_st *)ASN1_GENERALIZEDTIME_set((ASN1_GENERALIZEDTIME *)0x0,local_58);
    auVar1 = local_c0;
    local_40 = local_60 + -1;
    local_38 = local_60[-1];
    if (local_38 != (char *)0x0) {
      local_c0[0] = (internal)(local_78._M_head_impl != (asn1_string_st *)0x0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_78._M_head_impl != (asn1_string_st *)0x0) {
        local_c0._4_4_ = auVar1._4_4_;
        local_c0._0_4_ = 0x18;
        iVar3 = ASN1_STRING_type((ASN1_STRING *)local_78._M_head_impl);
        local_88._M_head_impl._0_4_ = iVar3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a8,"24","ASN1_STRING_type(generalized.get())",(int *)local_c0,
                   (int *)&local_88);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar8 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar8 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40a,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        _Var7._M_head_impl = local_78._M_head_impl;
        puVar5 = ASN1_STRING_get0_data(local_78._M_head_impl);
        iVar3 = ASN1_STRING_length((ASN1_STRING *)_Var7._M_head_impl);
        local_c0 = (undefined1  [8])(long)iVar3;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5;
        testing::internal::
        CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)local_a8,"t.generalized","ASN1StringToStringView(generalized.get())",
                   local_40,(basic_string_view<char,_std::char_traits<char>_> *)local_c0);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar9 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40b,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        bVar2 = ASN1Time_check_posix(local_78._M_head_impl,local_58);
        local_c0[0] = (internal)bVar2;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar2) {
          testing::Message::Message((Message *)&local_88);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)local_c0,
                     (AssertionResult *)"ASN1Time_check_posix(generalized.get(), t.time)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40c,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_a8._1_7_,local_a8[0]),
                            local_98._M_allocated_capacity + 1);
          }
          if (local_88._M_head_impl != (asn1_string_st *)0x0) {
            (**(code **)(*(long *)local_88._M_head_impl + 8))();
          }
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b8,local_b8);
          }
        }
        iVar3 = ASN1_TIME_to_posix(local_78._M_head_impl,&local_50);
        local_c0._0_4_ = iVar3;
        local_88._M_head_impl._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a8,"ASN1_TIME_to_posix(generalized.get(), &tt)","1",
                   (int *)local_c0,(int *)&local_88);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar9 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40d,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)local_a8,"tt","t.time",&local_50,&local_48->time);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar9 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40e,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        PrintStringToBIO_abi_cxx11_
                  ((string *)local_a8,local_78._M_head_impl,ASN1_GENERALIZEDTIME_print);
        ppcVar4 = local_60 + 1;
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)local_c0,
                   "PrintStringToBIO(generalized.get(), &ASN1_GENERALIZEDTIME_print)","t.printed",
                   (string *)local_a8,ppcVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_a8);
          pcVar9 = "";
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_b8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x411,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
          if ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
          }
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
        PrintStringToBIO_abi_cxx11_((string *)local_a8,local_78._M_head_impl,ASN1_TIME_print);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)local_c0,"PrintStringToBIO(generalized.get(), &ASN1_TIME_print)",
                   "t.printed",(string *)local_a8,ppcVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_a8);
          pcVar9 = "";
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_b8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x413,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
          _Var7._M_head_impl = (ASN1_TIME *)CONCAT71(local_a8._1_7_,local_a8[0]);
          goto LAB_001c743f;
        }
        goto LAB_001c744a;
      }
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)local_c0,(AssertionResult *)0x512969,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x409,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
      }
      if (local_88._M_head_impl != (ASN1_TIME *)0x0) {
        (**(code **)(*(long *)local_88._M_head_impl + 8))();
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
LAB_001c7c98:
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_78);
LAB_001c7ca2:
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_70);
      testing::ScopedTrace::~ScopedTrace(&local_a9);
      return;
    }
    local_c0[0] = (internal)(local_78._M_head_impl == (asn1_string_st *)0x0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_78._M_head_impl != (asn1_string_st *)0x0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)local_c0,(AssertionResult *)0x512969,"true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x415,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      _Var7._M_head_impl = local_88._M_head_impl;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1);
        _Var7._M_head_impl = local_88._M_head_impl;
      }
LAB_001c743f:
      if (_Var7._M_head_impl != (ASN1_TIME *)0x0) {
        (**(code **)(*(long *)_Var7._M_head_impl + 8))();
      }
LAB_001c744a:
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
    }
    local_88._M_head_impl = ASN1_TIME_set_posix((ASN1_TIME *)0x0,local_58);
    auVar1 = local_c0;
    if (local_38 == (char *)0x0) {
      local_c0[0] = (internal)(local_88._M_head_impl == (ASN1_TIME *)0x0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_88._M_head_impl != (ASN1_TIME *)0x0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,(AssertionResult *)0x514e98,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x426,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b8;
          __ptr = local_b8;
          goto LAB_001c7a46;
        }
      }
    }
    else {
      local_c0[0] = (internal)(local_88._M_head_impl != (ASN1_TIME *)0x0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_88._M_head_impl == (ASN1_TIME *)0x0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,(AssertionResult *)0x514e98,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x41a,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
        std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_88);
        goto LAB_001c7c98;
      }
      local_c0._4_4_ = auVar1._4_4_;
      if (pcVar10 == (char *)0x0) {
        local_c0._0_4_ = 0x18;
        local_80.data_._0_4_ = ASN1_STRING_type((ASN1_STRING *)local_88._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a8,"24","ASN1_STRING_type(choice.get())",(int *)local_c0,
                   (int *)&local_80);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar8 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar8 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x41f,pcVar8);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        _Var7._M_head_impl = local_88._M_head_impl;
        puVar5 = ASN1_STRING_get0_data(local_88._M_head_impl);
        iVar3 = ASN1_STRING_length((ASN1_STRING *)_Var7._M_head_impl);
        local_c0 = (undefined1  [8])(long)iVar3;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5;
        testing::internal::
        CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)local_a8,"t.generalized","ASN1StringToStringView(choice.get())",
                   local_40,(basic_string_view<char,_std::char_traits<char>_> *)local_c0);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar10 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar10 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x420,pcVar10);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)local_c0);
          goto LAB_001c77f6;
        }
      }
      else {
        local_c0._0_4_ = 0x17;
        local_80.data_._0_4_ = ASN1_STRING_type((ASN1_STRING *)local_88._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a8,"23","ASN1_STRING_type(choice.get())",(int *)local_c0,
                   (int *)&local_80);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar8 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar8 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x41c,pcVar8);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a0,local_a0);
        }
        _Var7._M_head_impl = local_88._M_head_impl;
        puVar5 = ASN1_STRING_get0_data(local_88._M_head_impl);
        iVar3 = ASN1_STRING_length((ASN1_STRING *)_Var7._M_head_impl);
        local_c0 = (undefined1  [8])(long)iVar3;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5;
        testing::internal::
        CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)local_a8,"t.utc","ASN1StringToStringView(choice.get())",local_60,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_c0);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar10 = "";
          if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar10 = (local_a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x41d,pcVar10);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)local_c0);
LAB_001c77f6:
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      bVar2 = ASN1Time_check_posix(local_88._M_head_impl,local_58);
      local_c0[0] = (internal)bVar2;
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)local_c0,
                   (AssertionResult *)"ASN1Time_check_posix(choice.get(), t.time)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x422,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a8._1_7_,local_a8[0]) != &local_98) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a8._1_7_,local_a8[0]),local_98._M_allocated_capacity + 1
                         );
        }
        if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,local_b8);
        }
      }
      iVar3 = ASN1_TIME_to_posix(local_88._M_head_impl,&local_50);
      local_c0._0_4_ = iVar3;
      local_80.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a8,"ASN1_TIME_to_posix(choice.get(), &tt)","1",(int *)local_c0,
                 (int *)&local_80);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        pcVar10 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x423,pcVar10);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_a8,"tt","t.time",&local_50,&local_48->time);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        pcVar8 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x424,pcVar8);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0;
        __ptr = local_a0;
LAB_001c7a46:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,__ptr);
      }
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_88);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_78);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_70);
    testing::ScopedTrace::~ScopedTrace(&local_a9);
    ppcVar4 = local_60 + 4;
    lVar6 = lVar6 + -0x20;
    if (lVar6 == 0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(ASN1Test, SetTime) {
  static const struct {
    int64_t time;
    const char *generalized;
    const char *utc;
    const char *printed;
  } kTests[] = {
      {-631152001, "19491231235959Z", nullptr, "Dec 31 23:59:59 1949 GMT"},
      {-631152000, "19500101000000Z", "500101000000Z",
       "Jan  1 00:00:00 1950 GMT"},
      {0, "19700101000000Z", "700101000000Z", "Jan  1 00:00:00 1970 GMT"},
      {981173106, "20010203040506Z", "010203040506Z",
       "Feb  3 04:05:06 2001 GMT"},
      {951804000, "20000229060000Z", "000229060000Z",
       "Feb 29 06:00:00 2000 GMT"},
      // NASA says this is the correct time for posterity.
      {-16751025, "19690621025615Z", "690621025615Z",
       "Jun 21 02:56:15 1969 GMT"},
      // -1 is sometimes used as an error value. Ensure we correctly handle it.
      {-1, "19691231235959Z", "691231235959Z", "Dec 31 23:59:59 1969 GMT"},
      {2524607999, "20491231235959Z", "491231235959Z",
       "Dec 31 23:59:59 2049 GMT"},
      {2524608000, "20500101000000Z", nullptr, "Jan  1 00:00:00 2050 GMT"},
      // Test boundary conditions.
      {-62167219200, "00000101000000Z", nullptr, "Jan  1 00:00:00 0 GMT"},
      {-62167219201, nullptr, nullptr, nullptr},
      {253402300799, "99991231235959Z", nullptr, "Dec 31 23:59:59 9999 GMT"},
      {253402300800, nullptr, nullptr, nullptr},
  };
  for (const auto &t : kTests) {
    int64_t tt;
    SCOPED_TRACE(t.time);

    bssl::UniquePtr<ASN1_UTCTIME> utc(ASN1_UTCTIME_set(nullptr, t.time));
    if (t.utc) {
      ASSERT_TRUE(utc);
      EXPECT_EQ(V_ASN1_UTCTIME, ASN1_STRING_type(utc.get()));
      EXPECT_EQ(t.utc, ASN1StringToStringView(utc.get()));
      EXPECT_TRUE(ASN1Time_check_posix(utc.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(utc.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
      EXPECT_EQ(PrintStringToBIO(utc.get(), &ASN1_UTCTIME_print), t.printed);
      EXPECT_EQ(PrintStringToBIO(utc.get(), &ASN1_TIME_print), t.printed);
    } else {
      EXPECT_FALSE(utc);
    }

    bssl::UniquePtr<ASN1_GENERALIZEDTIME> generalized(
        ASN1_GENERALIZEDTIME_set(nullptr, t.time));
    if (t.generalized) {
      ASSERT_TRUE(generalized);
      EXPECT_EQ(V_ASN1_GENERALIZEDTIME, ASN1_STRING_type(generalized.get()));
      EXPECT_EQ(t.generalized, ASN1StringToStringView(generalized.get()));
      EXPECT_TRUE(ASN1Time_check_posix(generalized.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(generalized.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
      EXPECT_EQ(
          PrintStringToBIO(generalized.get(), &ASN1_GENERALIZEDTIME_print),
          t.printed);
      EXPECT_EQ(PrintStringToBIO(generalized.get(), &ASN1_TIME_print),
                t.printed);
    } else {
      EXPECT_FALSE(generalized);
    }

    bssl::UniquePtr<ASN1_TIME> choice(ASN1_TIME_set_posix(nullptr, t.time));
    if (t.generalized) {
      ASSERT_TRUE(choice);
      if (t.utc) {
        EXPECT_EQ(V_ASN1_UTCTIME, ASN1_STRING_type(choice.get()));
        EXPECT_EQ(t.utc, ASN1StringToStringView(choice.get()));
      } else {
        EXPECT_EQ(V_ASN1_GENERALIZEDTIME, ASN1_STRING_type(choice.get()));
        EXPECT_EQ(t.generalized, ASN1StringToStringView(choice.get()));
      }
      EXPECT_TRUE(ASN1Time_check_posix(choice.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(choice.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
    } else {
      EXPECT_FALSE(choice);
    }
  }
}